

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O0

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:320:29)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
          *this,Field a,Field b)

{
  bool bVar1;
  bool bVar2;
  RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
  *this_local;
  Field b_local;
  Field a_local;
  
  b_local._8_8_ = a.type.id;
  this_local = (RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
                *)b.type.id;
  a_local.type.id._4_4_ = a.mutable_;
  b_local.type.id._4_4_ = b.mutable_;
  if (a_local.type.id._4_4_ == b_local.type.id._4_4_) {
    b_local.type.id = b._8_8_;
    bVar1 = Field::isPacked((Field *)&b_local.packedType);
    bVar2 = Field::isPacked((Field *)&this_local);
    if (bVar1 == bVar2) {
      a_local.type.id._0_4_ = a.packedType;
      if ((PackedType)a_local.type.id == (PackedType)b_local.type.id) {
        a_local.mutable_ = compare(this,(Type)b_local._8_8_,(Type)this_local);
      }
      else {
        a_local.mutable_ = 2;
        if ((int)(PackedType)a_local.type.id < (int)(PackedType)b_local.type.id) {
          a_local.mutable_ = Mutable;
        }
      }
    }
    else {
      bVar1 = Field::isPacked((Field *)&this_local);
      bVar2 = Field::isPacked((Field *)&b_local.packedType);
      a_local.mutable_ = 2;
      if (bVar1 < bVar2) {
        a_local.mutable_ = Mutable;
      }
    }
  }
  else {
    a_local.mutable_ = 2;
    if ((int)a_local.type.id._4_4_ < (int)b_local.type.id._4_4_) {
      a_local.mutable_ = Mutable;
    }
  }
  return a_local.mutable_;
}

Assistant:

Comparison compare(Field a, Field b) {
    if (a.mutable_ != b.mutable_) {
      return a.mutable_ < b.mutable_ ? LT : GT;
    }
    if (a.isPacked() != b.isPacked()) {
      return b.isPacked() < a.isPacked() ? LT : GT;
    }
    if (a.packedType != b.packedType) {
      return a.packedType < b.packedType ? LT : GT;
    }
    return compare(a.type, b.type);
  }